

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualified_name.cpp
# Opt level: O2

void __thiscall
duckdb::QualifiedColumnName::QualifiedColumnName
          (QualifiedColumnName *this,BindingAlias *alias,string *column_p)

{
  string *psVar1;
  
  ::std::__cxx11::string::string((string *)this,(string *)alias);
  ::std::__cxx11::string::string((string *)&this->schema,(string *)&alias->schema);
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(alias);
  ::std::__cxx11::string::string((string *)&this->table,(string *)psVar1);
  ::std::__cxx11::string::string((string *)&this->column,(string *)column_p);
  return;
}

Assistant:

QualifiedColumnName::QualifiedColumnName(const BindingAlias &alias, string column_p)
    : catalog(alias.GetCatalog()), schema(alias.GetSchema()), table(alias.GetAlias()), column(std::move(column_p)) {
}